

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

void visit_keys(node_t node_,vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_,
               _func_void_uchar_ptr_size_t_void_ptr *func_,void *arg_)

{
  bool bVar1;
  uint32_t uVar2;
  void *arg__00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  reference pvVar3;
  size_type sVar4;
  _func_void_uchar_ptr_size_t_void_ptr *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> in_RSI;
  size_t edgecount;
  size_t i;
  size_t prefix_length;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  ulong local_40;
  node_t node__00;
  node_t local_8;
  
  uVar2 = node_t::prefix_length(&local_8);
  arg__00 = (void *)(ulong)uVar2;
  node__00._data = (uchar *)in_RSI.container;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI.container);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)node_t::prefix(&local_8);
  node_t::prefix(&local_8);
  std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff78);
  std::
  copy<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((uchar *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RSI);
  uVar2 = node_t::refcount(&local_8);
  if (uVar2 != 0) {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff90 = in_RDX;
    if (bVar1) {
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!buffer_.empty ()",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
              ,0x22a);
      fflush(_stderr);
      zmq::zmq_abort((char *)0x23f85c);
      in_stack_ffffffffffffff90 = in_RDX;
    }
    in_RDX = in_stack_ffffffffffffff90;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)node__00._data,0);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)node__00._data);
    (*(code *)in_stack_ffffffffffffff90)(pvVar3,sVar4,in_RCX);
  }
  local_40 = 0;
  uVar2 = node_t::edgecount(&local_8);
  for (; local_40 < uVar2; local_40 = local_40 + 1) {
    node_t::node_at((node_t *)in_RSI.container,(size_t)in_stack_ffffffffffffff90);
    visit_keys(node__00,in_RDX,in_RCX,arg__00);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)node__00._data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this,(size_type)in_RSI.container);
  return;
}

Assistant:

static void
visit_keys (node_t node_,
            std::vector<unsigned char> &buffer_,
            void (*func_) (unsigned char *data_, size_t size_, void *arg_),
            void *arg_)
{
    const size_t prefix_length = node_.prefix_length ();
    buffer_.reserve (buffer_.size () + prefix_length);
    std::copy (node_.prefix (), node_.prefix () + prefix_length,
               std::back_inserter (buffer_));

    if (node_.refcount () > 0) {
        zmq_assert (!buffer_.empty ());
        func_ (&buffer_[0], buffer_.size (), arg_);
    }

    for (size_t i = 0, edgecount = node_.edgecount (); i < edgecount; ++i) {
        visit_keys (node_.node_at (i), buffer_, func_, arg_);
    }
    buffer_.resize (buffer_.size () - prefix_length);
}